

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_type.cpp
# Opt level: O1

string * __thiscall
duckdb::ExpressionTypeToOperator_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ExpressionType type)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar1 = (int)this;
  switch(iVar1) {
  case 0x19:
    pcVar3 = "=";
    pcVar2 = "";
    break;
  case 0x1a:
    pcVar3 = "!=";
    pcVar2 = "";
    break;
  case 0x1b:
    pcVar3 = "<";
    pcVar2 = "";
    break;
  case 0x1c:
    pcVar3 = ">";
    pcVar2 = "";
    break;
  case 0x1d:
    pcVar3 = "<=";
    pcVar2 = "";
    break;
  case 0x1e:
    pcVar3 = ">=";
    pcVar2 = "";
    break;
  case 0x25:
    pcVar3 = "IS DISTINCT FROM";
    pcVar2 = "";
    break;
  case 0x28:
    pcVar3 = "IS NOT DISTINCT FROM";
    pcVar2 = "";
    break;
  default:
    if (iVar1 == 0x32) {
      pcVar3 = "AND";
      pcVar2 = "";
      break;
    }
    if (iVar1 == 0x33) {
      pcVar3 = "OR";
      pcVar2 = "";
      break;
    }
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
    pcVar2 = anon_var_dwarf_4f001a4 + 9;
    pcVar3 = anon_var_dwarf_4f001a4 + 9;
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string ExpressionTypeToOperator(ExpressionType type) {
	switch (type) {
	case ExpressionType::COMPARE_EQUAL:
		return "=";
	case ExpressionType::COMPARE_NOTEQUAL:
		return "!=";
	case ExpressionType::COMPARE_LESSTHAN:
		return "<";
	case ExpressionType::COMPARE_GREATERTHAN:
		return ">";
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return "<=";
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return ">=";
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return "IS DISTINCT FROM";
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return "IS NOT DISTINCT FROM";
	case ExpressionType::CONJUNCTION_AND:
		return "AND";
	case ExpressionType::CONJUNCTION_OR:
		return "OR";
	default:
		return "";
	}
}